

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O0

Slice leveldb::anon_unknown_1::PosixWritableFile::Basename(string *filename)

{
  Slice SVar1;
  size_type sVar2;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_retaddr;
  char in_stack_0000000f;
  size_type separator_pos;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb8;
  string *in_stack_ffffffffffffffc0;
  Slice *in_stack_ffffffffffffffc8;
  size_type in_stack_ffffffffffffffd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd8;
  undefined7 local_18;
  char in_stack_ffffffffffffffef;
  size_t local_10;
  size_type __pos;
  
  __pos = *(size_type *)(in_FS_OFFSET + 0x28);
  sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::rfind
                    (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffef,in_stack_ffffffffffffffd0);
  if (sVar2 == 0xffffffffffffffff) {
    Slice::Slice(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  }
  else {
    sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                      (unaff_retaddr,in_stack_0000000f,__pos);
    if (sVar2 != 0xffffffffffffffff) {
      __assert_fail("filename.find(\'/\', separator_pos + 1) == std::string::npos",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/util/env_posix.cc"
                    ,0x1ad,
                    "static Slice leveldb::(anonymous namespace)::PosixWritableFile::Basename(const std::string &)"
                   );
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
              (in_stack_ffffffffffffffb8);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::length
              (in_stack_ffffffffffffffb8);
    Slice::Slice(in_stack_ffffffffffffffc8,(char *)in_stack_ffffffffffffffc0,
                 (size_t)in_stack_ffffffffffffffb8);
  }
  SVar1.data_._7_1_ = in_stack_ffffffffffffffef;
  SVar1.data_._0_7_ = local_18;
  if (*(size_type *)(in_FS_OFFSET + 0x28) == __pos) {
    SVar1.size_ = local_10;
    return SVar1;
  }
  __stack_chk_fail();
}

Assistant:

static Slice Basename(const std::string& filename) {
    std::string::size_type separator_pos = filename.rfind('/');
    if (separator_pos == std::string::npos) {
      return Slice(filename);
    }
    // The filename component should not contain a path separator. If it does,
    // the splitting was done incorrectly.
    assert(filename.find('/', separator_pos + 1) == std::string::npos);

    return Slice(filename.data() + separator_pos + 1,
                 filename.length() - separator_pos - 1);
  }